

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O2

int GmfSetHONodesOrdering(int64_t MshIdx,int KwdCod,int *BasTab,int *OrdTab)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  void *pvVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  GmfMshSct *msh;
  int *piVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lStack_40;
  
  iVar10 = 0;
  if (KwdCod - 0xf1U < 0xffffff10) {
    return 0;
  }
  uVar3 = KwdCod & 0xff;
  lStack_40 = 1;
  switch(uVar3) {
  case 0x56:
    lStack_40 = 4;
    uVar3 = 0x12;
    break;
  case 0x57:
    lStack_40 = 3;
    uVar3 = 0xe;
    break;
  case 0x58:
    lStack_40 = 2;
    uVar3 = 0x10;
    break;
  case 0x59:
    lStack_40 = 2;
    uVar3 = 0x19;
    break;
  case 0x5a:
    lStack_40 = 3;
LAB_0010a91b:
    uVar3 = 10;
    break;
  case 0x5b:
    lStack_40 = 3;
    uVar3 = 0xf;
    break;
  case 0x5c:
    goto switchD_0010a895_caseD_5c;
  case 0x5d:
switchD_0010a895_caseD_5d:
    uVar3 = 5;
    break;
  case 0x5e:
  case 0x5f:
    goto switchD_0010a895_caseD_5e;
  case 0x60:
    lStack_40 = 4;
    uVar3 = 0x14;
    break;
  case 0x61:
    lStack_40 = 4;
    uVar3 = 0x23;
    break;
  case 0x62:
    lStack_40 = 3;
    uVar3 = 0x40;
    break;
  case 99:
    lStack_40 = 3;
    uVar3 = 0x7d;
    break;
  case 100:
    lStack_40 = 3;
    uVar3 = 0x1e;
    break;
  case 0x65:
    lStack_40 = 3;
    uVar3 = 0x37;
    break;
  case 0x66:
    lStack_40 = 4;
    uVar3 = 0x28;
    break;
  case 0x67:
    lStack_40 = 4;
    uVar3 = 0x4b;
    break;
  default:
    switch(uVar3) {
    case 5:
      uVar3 = 2;
      break;
    case 6:
      lStack_40 = 3;
switchD_0010a8c0_caseD_19:
      uVar3 = 3;
      break;
    case 7:
      lStack_40 = 2;
      goto switchD_0010a895_caseD_5c;
    case 8:
      lStack_40 = 4;
switchD_0010a895_caseD_5c:
      uVar3 = 4;
      break;
    case 9:
      lStack_40 = 4;
LAB_0010a97b:
      uVar3 = 6;
      break;
    case 10:
      lStack_40 = 3;
      uVar3 = 8;
      break;
    default:
      switch(uVar3) {
      case 0x18:
        lStack_40 = 3;
        goto LAB_0010a97b;
      case 0x19:
        goto switchD_0010a8c0_caseD_19;
      case 0x1a:
      case 0x1c:
      case 0x1d:
      case 0x1f:
      case 0x20:
        goto switchD_0010a895_caseD_5e;
      case 0x1b:
        lStack_40 = 2;
        uVar3 = 9;
        break;
      case 0x1e:
        lStack_40 = 4;
        goto LAB_0010a91b;
      case 0x21:
        lStack_40 = 3;
        uVar3 = 0x1b;
        break;
      default:
        if (uVar3 != 0x31) {
          return 0;
        }
        lStack_40 = 3;
        goto switchD_0010a895_caseD_5d;
      }
    }
  }
  free(*(void **)(MshIdx + 0x10c8 + (ulong)(uint)KwdCod * 0x3300));
  pvVar4 = malloc((ulong)(uVar3 * 4));
  *(void **)(MshIdx + 0x10c8 + (ulong)(uint)KwdCod * 0x3300) = pvVar4;
  iVar10 = 0;
  if (pvVar4 != (void *)0x0) {
    uVar5 = (ulong)uVar3;
    uVar7 = (ulong)(uint)((int)lStack_40 * 4);
    for (uVar8 = 0; uVar8 != uVar5; uVar8 = uVar8 + 1) {
      piVar9 = OrdTab;
      for (uVar11 = 0; uVar11 != uVar5; uVar11 = uVar11 + 1) {
        lVar12 = 0;
        do {
          if (lStack_40 == lVar12) {
            *(int *)((long)pvVar4 + uVar11 * 4) = (int)uVar8;
            break;
          }
          piVar1 = BasTab + lVar12;
          piVar2 = piVar9 + lVar12;
          lVar12 = lVar12 + 1;
        } while (*piVar1 == *piVar2);
        piVar9 = (int *)((long)piVar9 + uVar7);
      }
      BasTab = (int *)((long)BasTab + uVar7);
    }
    iVar10 = 1;
    for (uVar6 = 0; uVar6 != uVar3; uVar6 = uVar6 + 1) {
      uVar7 = 0;
      do {
        if (uVar5 == uVar7) {
          for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
            *(int *)((long)pvVar4 + uVar7 * 4) = (int)uVar7;
          }
          return 0;
        }
        lVar12 = uVar7 * 4;
        uVar7 = uVar7 + 1;
      } while (*(uint *)((long)pvVar4 + lVar12) != uVar6);
    }
  }
switchD_0010a895_caseD_5e:
  return iVar10;
}

Assistant:

int GmfSetHONodesOrdering(int64_t MshIdx, int KwdCod, int *BasTab, int *OrdTab)
{
   int i, j, k, flg, NmbNod, NmbCrd;
   GmfMshSct   *msh = (GmfMshSct *)MshIdx;
   KwdSct      *kwd;
   
   if( (KwdCod < 1) || (KwdCod > GmfMaxKwd) )
      return(0);

   kwd = &msh->KwdTab[ KwdCod ];

   // Find the Bezier indices dimension according to the element's kind
   switch(KwdCod)
   {
      case GmfEdges   :          NmbNod =  2; NmbCrd = 1; break;
      case GmfEdgesP2 :          NmbNod =  3; NmbCrd = 1; break;
      case GmfEdgesP3 :          NmbNod =  4; NmbCrd = 1; break;
      case GmfEdgesP4 :          NmbNod =  5; NmbCrd = 1; break;
      case GmfTriangles   :      NmbNod =  3; NmbCrd = 3; break;
      case GmfTrianglesP2 :      NmbNod =  6; NmbCrd = 3; break;
      case GmfTrianglesP3 :      NmbNod = 10; NmbCrd = 3; break;
      case GmfTrianglesP4 :      NmbNod = 15; NmbCrd = 3; break;
      case GmfQuadrilaterals   : NmbNod =  4; NmbCrd = 2; break;
      case GmfQuadrilateralsQ2 : NmbNod =  9; NmbCrd = 2; break;
      case GmfQuadrilateralsQ3 : NmbNod = 16; NmbCrd = 2; break;
      case GmfQuadrilateralsQ4 : NmbNod = 25; NmbCrd = 2; break;
      case GmfTetrahedra   :     NmbNod =  4; NmbCrd = 4; break;
      case GmfTetrahedraP2 :     NmbNod = 10; NmbCrd = 4; break;
      case GmfTetrahedraP3 :     NmbNod = 20; NmbCrd = 4; break;
      case GmfTetrahedraP4 :     NmbNod = 35; NmbCrd = 4; break;
      case GmfPyramids   :       NmbNod =  5; NmbCrd = 3; break;
      case GmfPyramidsP2 :       NmbNod = 14; NmbCrd = 3; break;
      case GmfPyramidsP3 :       NmbNod = 30; NmbCrd = 3; break;
      case GmfPyramidsP4 :       NmbNod = 55; NmbCrd = 3; break;
      case GmfPrisms   :         NmbNod =  6; NmbCrd = 4; break;
      case GmfPrismsP2 :         NmbNod = 18; NmbCrd = 4; break;
      case GmfPrismsP3 :         NmbNod = 40; NmbCrd = 4; break;
      case GmfPrismsP4 :         NmbNod = 75; NmbCrd = 4; break;
      case GmfHexahedra   :      NmbNod =  8; NmbCrd = 3; break;
      case GmfHexahedraQ2 :      NmbNod = 27; NmbCrd = 3; break;
      case GmfHexahedraQ3 :      NmbNod = 64; NmbCrd = 3; break;
      case GmfHexahedraQ4 :      NmbNod =125; NmbCrd = 3; break;
      default : return(0);
   }

   // Free and rebuild the mapping table if there were already one
   if(kwd->OrdTab)
      free(kwd->OrdTab);

   if(!(kwd->OrdTab = malloc(NmbNod * sizeof(int))))
      return(0);

   // Find the corresponding Bezier coordinates from the source table
   for(i=0;i<NmbNod;i++)
   {
      for(j=0;j<NmbNod;j++)
      {
         flg = 1;

         for(k=0;k<NmbCrd;k++)
            if(BasTab[ i * NmbCrd + k ] != OrdTab[ j * NmbCrd + k ])
            {
               flg = 0;
               break;
            }

         if(flg)
            kwd->OrdTab[j] = i;
      }
   }

   // Check the ordering consistency
   for(i=0;i<NmbNod;i++)
   {
      flg = 0;

      for(j=0;j<NmbNod;j++)
         if(kwd->OrdTab[j] == i)
         {
            flg = 1;
            break;
         }

      if(!flg)
      {
         for(j=0;j<NmbNod;j++)
            kwd->OrdTab[j] = j;

         return(0);
      }
   }

   return(1);
}